

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O3

void reoProfileAplStart(reo_man *p)

{
  int iVar1;
  int iVar2;
  reo_plane *prVar3;
  reo_unit **pprVar4;
  long lVar5;
  long lVar6;
  reo_unit *prVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar1 = p->nSupp;
  lVar5 = (long)iVar1;
  if (0 < lVar5) {
    prVar3 = p->pPlanes;
    lVar6 = 0;
    do {
      for (prVar7 = prVar3[lVar6].pHead; prVar7 != (reo_unit *)0x0; prVar7 = prVar7->Next) {
        prVar7->Weight = 0.0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  iVar2 = p->nTops;
  if (0 < (long)iVar2) {
    pprVar4 = p->pTops;
    lVar6 = 0;
    do {
      uVar8 = (ulong)pprVar4[lVar6] & 0xfffffffffffffffe;
      *(double *)(uVar8 + 0x28) = *(double *)(uVar8 + 0x28) + 1.0;
      lVar6 = lVar6 + 1;
    } while (iVar2 != lVar6);
  }
  prVar3 = p->pPlanes;
  dVar10 = 0.0;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      prVar3[lVar6].statsCost = 0.0;
      prVar7 = prVar3[lVar6].pHead;
      dVar11 = 0.0;
      if (prVar7 != (reo_unit *)0x0) {
        do {
          uVar8 = (ulong)prVar7->pE & 0xfffffffffffffffe;
          uVar9 = (ulong)prVar7->pT & 0xfffffffffffffffe;
          dVar12 = prVar7->Weight * 0.5;
          *(double *)(uVar8 + 0x28) = *(double *)(uVar8 + 0x28) + dVar12;
          *(double *)(uVar9 + 0x28) = dVar12 + *(double *)(uVar9 + 0x28);
          dVar11 = dVar11 + prVar7->Weight;
          prVar7 = prVar7->Next;
        } while (prVar7 != (reo_unit *)0x0);
        prVar3[lVar6].statsCost = dVar11;
      }
      dVar10 = dVar10 + dVar11;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  prVar3[lVar5].statsCost = 0.0;
  p->nAplCur = dVar10;
  p->nAplBeg = dVar10;
  return;
}

Assistant:

void reoProfileAplStart( reo_man * p )
{
    reo_unit * pER, * pTR;
    reo_unit * pUnit;
    double Res, Half;
    int i;

    // clean the weights of all nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            pUnit->Weight = 0.0;
    // to assign the node weights (the probability of visiting each node)
    // we visit the node after visiting its predecessors

    // set the probability of visits to the top nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->Weight += 1.0;

    // to compute the path length (the sum of products of edge weight by edge length)
    // we visit the nodes in any order (the above order will do)
    Res = 0.0;
    for ( i = 0; i < p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = 0.0;
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            pER  = Unit_Regular(pUnit->pE);
            pTR  = Unit_Regular(pUnit->pT);
            Half = 0.5 * pUnit->Weight;
            pER->Weight += Half;
            pTR->Weight += Half;
            // add to the path length
            p->pPlanes[i].statsCost += pUnit->Weight;
        }
        Res += p->pPlanes[i].statsCost;
    }
    p->pPlanes[p->nSupp].statsCost = 0.0;
    p->nAplBeg = p->nAplCur = Res;
}